

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_DumpLibrary(Dtt_Man_t *p,char *FileName)

{
  uint uVar1;
  uint uVar2;
  uint tNpn;
  uint tNpn_00;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  void *__dest;
  Vec_Vec_t *vLibImpl;
  void **ppvVar12;
  Vec_Int_t *pVVar13;
  uint *pType;
  void **ppvVar14;
  FILE *__stream;
  int i;
  uint uVar15;
  size_t sVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int i_1;
  int iVar24;
  ulong uVar25;
  char str [100];
  ulong local_e8;
  long *local_c0;
  uint local_b4;
  uint local_98 [26];
  
  pVVar13 = p->vTruthNpns;
  pvVar11 = malloc(0x10);
  iVar18 = pVVar13->nSize;
  uVar19 = (ulong)iVar18;
  if (uVar19 == 0) {
    *(undefined8 *)((long)pvVar11 + 8) = 0;
    uVar19 = 0;
  }
  else {
    __dest = malloc(uVar19 * 4);
    *(void **)((long)pvVar11 + 8) = __dest;
    memcpy(__dest,pVVar13->pArray,uVar19 * 4);
    if (1 < iVar18) {
      qsort(__dest,uVar19,4,Vec_IntSortCompare1);
      uVar9 = 1;
      sVar16 = 1;
      do {
        iVar18 = *(int *)((long)__dest + sVar16 * 4);
        if (iVar18 != *(int *)((long)__dest + sVar16 * 4 + -4)) {
          lVar20 = (long)(int)uVar9;
          uVar9 = uVar9 + 1;
          *(int *)((long)__dest + lVar20 * 4) = iVar18;
        }
        sVar16 = sVar16 + 1;
      } while (uVar19 != sVar16);
      uVar19 = (ulong)uVar9;
    }
  }
  local_c0 = (long *)((long)pvVar11 + 8);
  vLibImpl = (Vec_Vec_t *)malloc(0x10);
  uVar9 = (uint)uVar19;
  local_b4 = 8;
  if (6 < uVar9 - 1) {
    local_b4 = uVar9;
  }
  vLibImpl->nCap = local_b4;
  if (local_b4 == 0) {
    ppvVar12 = (void **)0x0;
  }
  else {
    ppvVar12 = (void **)malloc((long)(int)local_b4 << 3);
  }
  vLibImpl->pArray = ppvVar12;
  uVar22 = uVar19 & 0xffffffff;
  if (0 < (int)uVar9) {
    uVar23 = 0;
    do {
      pvVar11 = calloc(1,0x10);
      ppvVar12[uVar23] = pvVar11;
      uVar23 = uVar23 + 1;
    } while (uVar22 != uVar23);
  }
  vLibImpl->nSize = uVar9;
  pVVar13 = p->vTruths;
  uVar23 = (ulong)(uint)pVVar13->nSize;
  uVar17 = uVar9;
  if (pVVar13->nSize < 1) {
LAB_00520601:
    __stream = fopen(FileName,"wb");
    if (0 < (int)uVar9) {
      local_e8 = 0;
      do {
        if (1 < local_e8) {
          if ((long)(int)uVar17 <= (long)local_e8) {
LAB_0052074a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          ppvVar12 = vLibImpl->pArray;
          pvVar11 = ppvVar12[local_e8];
          if (0 < *(int *)((long)pvVar11 + 4)) {
            uVar9 = *(uint *)(*local_c0 + local_e8 * 4);
            lVar20 = 0;
            do {
              local_98[0] = local_98[0] & 0xffffff00;
              Dtt_MakeFormula(uVar9,*(Dtt_FunImpl_t **)(*(long *)((long)pvVar11 + 8) + lVar20 * 8),
                              vLibImpl,0x43210,(char *)local_98,1,(FILE *)__stream);
              lVar20 = lVar20 + 1;
              pvVar11 = ppvVar12[local_e8];
            } while (lVar20 < *(int *)((long)pvVar11 + 4));
          }
        }
        local_e8 = local_e8 + 1;
      } while (local_e8 != uVar22);
    }
    fclose(__stream);
    printf("Dumped file \"%s\". \n",FileName);
    fflush(_stdout);
  }
  uVar21 = 0;
  uVar25 = uVar19 & 0xffffffff;
  uVar19 = uVar19 & 0xffffffff;
LAB_00520223:
  if (uVar21 < 2) goto LAB_005205ec;
  piVar5 = pVVar13->pArray;
  uVar17 = piVar5[uVar21];
  pType = (uint *)calloc(1,0x14);
  if ((long)p->vConfigs->nSize <= (long)uVar21) {
LAB_00520769:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  *pType = p->vConfigs->pArray[uVar21] & 7;
  lVar20 = uVar21 * 2 + 1;
  if (p->vFanins->nSize <= (int)lVar20) goto LAB_00520769;
  piVar6 = p->vFanins->pArray;
  uVar1 = piVar6[lVar20];
  lVar20 = (long)(int)uVar1;
  if ((lVar20 < 0) || ((int)uVar23 <= (int)uVar1)) goto LAB_00520769;
  iVar18 = piVar6[uVar21 * 2];
  if ((long)iVar18 < 0) goto LAB_00520769;
  uVar2 = p->vTruthNpns->nSize;
  if (((int)uVar2 <= iVar18) || (uVar2 <= uVar1)) goto LAB_00520769;
  if ((int)uVar9 < 1) {
    pType[2] = 0xffffffff;
    pType[4] = 0xffffffff;
    if ((ulong)(long)(int)uVar2 <= uVar21) goto LAB_00520769;
    goto LAB_0052074a;
  }
  uVar1 = piVar5[lVar20];
  piVar5 = p->vTruthNpns->pArray;
  tNpn = piVar5[iVar18];
  tNpn_00 = piVar5[lVar20];
  lVar20 = *local_c0;
  uVar23 = 0;
  do {
    if (*(uint *)(lVar20 + uVar23 * 4) == tNpn) goto LAB_00520308;
    uVar23 = uVar23 + 1;
  } while (uVar22 != uVar23);
  uVar23 = 0xffffffff;
LAB_00520308:
  uVar10 = (uint)uVar23;
  pType[2] = uVar10;
  uVar23 = 0;
  do {
    if (*(uint *)(lVar20 + uVar23 * 4) == tNpn_00) goto LAB_00520325;
    uVar23 = uVar23 + 1;
  } while (uVar22 != uVar23);
  uVar23 = 0xffffffff;
LAB_00520325:
  uVar15 = (uint)uVar23;
  pType[4] = uVar15;
  if ((long)(int)uVar2 <= (long)uVar21) goto LAB_00520769;
  if ((int)uVar9 < 1) goto LAB_0052074a;
  uVar2 = piVar5[uVar21];
  lVar20 = 0;
  do {
    uVar23 = 0;
    while (*(uint *)(*local_c0 + uVar23 * 4) != uVar2) {
      uVar23 = uVar23 + 1;
      if (uVar22 == uVar23) goto LAB_0052074a;
    }
    iVar18 = (int)uVar19;
    if (iVar18 <= (int)uVar23) goto LAB_0052074a;
    ppvVar12 = vLibImpl->pArray;
    if (*(int *)((long)ppvVar12[uVar23] + 4) <= lVar20) {
      Dtt_FindNP(p,uVar2,0,uVar17,(int *)local_98,(int *)pType,0);
      uVar2 = local_98[0];
      Dtt_FindNP(p,uVar1,uVar17,tNpn,(int *)(pType + 1),(int *)pType,local_98[0]);
      Dtt_FindNP(p,uVar1,0,tNpn_00,(int *)(pType + 3),(int *)pType,uVar2);
      if ((long)p->vTruthNpns->nSize <= (long)uVar21) goto LAB_00520769;
      uVar23 = 0;
      goto LAB_005204ac;
    }
    uVar23 = 0;
    while (*(uint *)(*local_c0 + uVar23 * 4) != uVar2) {
      uVar23 = uVar23 + 1;
      if (uVar22 == uVar23) goto LAB_0052074a;
    }
    if (iVar18 <= (int)uVar23) goto LAB_0052074a;
    if (*(int *)((long)ppvVar12[uVar23 & 0xffffffff] + 4) <= lVar20) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    lVar7 = *(long *)(*(long *)((long)ppvVar12[uVar23 & 0xffffffff] + 8) + lVar20 * 8);
    uVar3 = *(uint *)(lVar7 + 8);
    uVar4 = *(uint *)(lVar7 + 0x10);
  } while ((uVar4 != uVar15 || uVar3 != uVar10) &&
          (lVar20 = lVar20 + 1, uVar3 != uVar15 || uVar4 != uVar10));
  free(pType);
  uVar25 = uVar19;
LAB_005205ec:
  uVar17 = (uint)uVar25;
  uVar21 = uVar21 + 1;
  pVVar13 = p->vTruths;
  uVar23 = (ulong)pVVar13->nSize;
  if ((long)uVar23 <= (long)uVar21) goto LAB_00520601;
  goto LAB_00520223;
  while (uVar23 = uVar23 + 1, uVar22 != uVar23) {
LAB_005204ac:
    if (*(int *)(*local_c0 + uVar23 * 4) == p->vTruthNpns->pArray[uVar21]) goto LAB_005204c0;
  }
  uVar23 = 0xffffffff;
LAB_005204c0:
  iVar24 = (int)uVar23;
  if (iVar18 <= iVar24) {
    uVar17 = iVar24 + 1;
    if ((int)local_b4 <= iVar24) {
      if (ppvVar12 == (void **)0x0) {
        ppvVar14 = (void **)malloc((long)(int)uVar17 << 3);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar12,(long)(int)uVar17 << 3);
      }
      vLibImpl->pArray = ppvVar14;
      vLibImpl->nCap = uVar17;
      local_b4 = uVar17;
    }
    lVar20 = 0;
    do {
      pvVar11 = calloc(1,0x10);
      ppvVar12[iVar18 + lVar20] = pvVar11;
      lVar20 = lVar20 + 1;
    } while ((iVar24 - iVar18) + 1 != (int)lVar20);
    uVar19 = (ulong)uVar17;
    vLibImpl->nSize = uVar17;
  }
  if ((iVar24 < 0) || ((int)uVar19 <= iVar24)) goto LAB_0052074a;
  puVar8 = (uint *)ppvVar12[uVar23 & 0xffffffff];
  uVar17 = puVar8[1];
  if (uVar17 == *puVar8) {
    if ((int)uVar17 < 0x10) {
      if (*(void **)(puVar8 + 2) == (void *)0x0) {
        pvVar11 = malloc(0x80);
      }
      else {
        pvVar11 = realloc(*(void **)(puVar8 + 2),0x80);
      }
      *(void **)(puVar8 + 2) = pvVar11;
      *puVar8 = 0x10;
    }
    else {
      if (*(void **)(puVar8 + 2) == (void *)0x0) {
        pvVar11 = malloc((ulong)uVar17 << 4);
      }
      else {
        pvVar11 = realloc(*(void **)(puVar8 + 2),(ulong)uVar17 << 4);
      }
      *(void **)(puVar8 + 2) = pvVar11;
      *puVar8 = uVar17 * 2;
    }
  }
  else {
    pvVar11 = *(void **)(puVar8 + 2);
  }
  uVar17 = puVar8[1];
  puVar8[1] = uVar17 + 1;
  *(uint **)((long)pvVar11 + (long)(int)uVar17 * 8) = pType;
  uVar25 = uVar19;
  goto LAB_005205ec;
}

Assistant:

void Dtt_DumpLibrary( Dtt_Man_t * p, char* FileName )
{
    FILE * pFile;
    char str[100], sFI1[50], sFI2[50];
    int i, j, Entry, fRepeat;
    Dtt_FunImpl_t * pFun, * pFun2;
    Vec_Int_t * vLibFun = Vec_IntDup( p->vTruthNpns );  // none-duplicating vector of NPN representitives
    Vec_Vec_t * vLibImpl;
    Vec_IntUniqify( vLibFun );
    vLibImpl = Vec_VecStart( Vec_IntSize( vLibFun ) );
    Vec_IntForEachEntry( p->vTruths, Entry, i )
    {
        int NP, Fanin2, Fanin1Npn, Fanin2Npn;
        if (i<2) continue; // skip const 0
        pFun = ABC_CALLOC( Dtt_FunImpl_t, 1 );
        pFun->Type = (int)( 0x7 & Vec_IntEntry(p->vConfigs, i) );
        //word Fanin1 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2+1 ) );
        Fanin1Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2+1 ) );
        pFun->FI1 = Vec_IntFind( vLibFun, Fanin1Npn );
        pFun->FI2 = Vec_IntFind( vLibFun, Fanin2Npn );
        
        fRepeat = 0;
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun2, j, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ) )
        {
            if ( ( pFun2->FI1 == pFun->FI1 && pFun2->FI2 == pFun->FI2 ) || ( pFun2->FI2 == pFun->FI1 && pFun2->FI1 == pFun->FI2 ) )
            {
                fRepeat = 1;
                break;
            }
        }
        if (fRepeat) 
        {
            ABC_FREE( pFun );
            continue;
        }

        Dtt_FindNP( p, Vec_IntEntry( p->vTruthNpns, i ), 0, Entry, &NP, &(pFun->Type), 0 ); //out: tGoal=0, NPout=0
        Dtt_FindNP( p, Fanin2, Entry, Fanin1Npn, &(pFun->NP1), &(pFun->Type), NP ); //FI1
        Dtt_FindNP( p, Fanin2, 0, Fanin2Npn, &(pFun->NP2), &(pFun->Type), NP ); //FI2: tGoal=0
        
        Vec_VecPush( vLibImpl, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ), pFun );
    }

    // print to file
    pFile = fopen( FileName, "wb" );

    if (0)
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if (!Entry) continue; // skip const 0
        fprintf( pFile, "%08x: ", (unsigned)Entry );
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            Dtt_FunImplFI2Str( pFun->FI1, pFun->NP1, vLibFun, sFI1 ); 
            Dtt_FunImplFI2Str( pFun->FI2, pFun->NP2, vLibFun, sFI2 );
            Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, str );
            fprintf( pFile, "%s, ", str );
        }
        fprintf( pFile, "\n" );
    }

    // formula format
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if ( i<2 ) continue; // skip const 0 and buffer
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            str[0] = 0; //sprintf( str, "" );
            Dtt_MakeFormula( (unsigned)Entry, pFun, vLibImpl, (4<<16)+(3<<12)+(2<<8)+(1<<4), str, 1, pFile );
        }
    }

    fclose( pFile );
    printf( "Dumped file \"%s\". \n", FileName );
    fflush( stdout );
}